

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O3

void anon_unknown.dwarf_23be6::decrease_runners(void)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  lVar4 = (anonymous_namespace)::Shmem;
  if (iVar1 != 0) {
    die("lock failed");
  }
  if ((int)(anonymous_namespace)::Cores._128_4_ < *(int *)((anonymous_namespace)::Shmem + 0x148c)) {
    die("Shmem->Running <= Cores failed at line __LINE__");
  }
  *(int *)((anonymous_namespace)::Shmem + 0x148c) =
       *(int *)((anonymous_namespace)::Shmem + 0x148c) + -1;
  uVar2 = 99;
  do {
    uVar3 = (ulong)uVar2;
    iVar1 = *(int *)(lVar4 + 0x12f8 + uVar3 * 4);
    if (iVar1 != 0) {
      *(int *)(lVar4 + 0x12f8 + uVar3 * 4) = iVar1 + -1;
      iVar1 = pthread_cond_signal((pthread_cond_t *)(lVar4 + uVar3 * 0x30 + 0x38));
      lVar4 = (anonymous_namespace)::Shmem;
      if (iVar1 != 0) {
        die("pthread_cond_signal failed");
      }
      break;
    }
    bVar5 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar5);
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 8));
  if (iVar1 != 0) {
    die("unlock failed");
  }
  return;
}

Assistant:

void decrease_runners(void) {
  if (pthread_mutex_lock(&Shmem->Lock) != 0)
    die("lock failed");

  assert(Shmem->Running <= Cores);

  Shmem->Running--;
  // FIXME could cache the max depth, perhaps don't care
  for (int i = MAX_DEPTH - 1; i >= 0; --i) {
    if (Shmem->Waiting[i] != 0) {
      Shmem->Waiting[i]--;
      if (pthread_cond_signal(&Shmem->Cond[i]) != 0)
        die("pthread_cond_signal failed");
      break;
    }
  }

  if (pthread_mutex_unlock(&Shmem->Lock) != 0)
    die("unlock failed");
}